

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_dispatch.cpp
# Opt level: O2

void __thiscall DStoredCommand::Tick(DStoredCommand *this)

{
  FConsoleCommand *pFVar1;
  FCommandLine args;
  FCommandLine local_30;
  
  if ((this->Text != (char *)0x0) && (pFVar1 = this->Command, pFVar1 != (FConsoleCommand *)0x0)) {
    local_30._argc = -1;
    local_30._argv = (char **)0x0;
    local_30.noescapes = false;
    local_30.cmd = this->Text;
    (*pFVar1->_vptr_FConsoleCommand[3])(pFVar1,&local_30,(&players)[(long)consoleplayer * 0x54],0);
    FCommandLine::~FCommandLine(&local_30);
  }
  (*(this->super_DThinker).super_DObject._vptr_DObject[4])(this);
  return;
}

Assistant:

void DStoredCommand::Tick ()
{
	if (Text != NULL && Command != NULL)
	{
		FCommandLine args (Text);
		Command->Run (args, players[consoleplayer].mo, 0);
	}
	Destroy ();
}